

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O1

wchar_t * do_mvis(wchar_t *dst,wint_t c,wchar_t flags,wint_t nextc,wchar_t *extra)

{
  int iVar1;
  wchar_t *pwVar2;
  
  if ((c != 10) &&
     ((((iVar1 = iswspace(c), iVar1 != 0 && ((nextc == 10 || (nextc == 0xd)))) ||
       ((iVar1 = iswspace(c), iVar1 == 0 && ((c < 0x21 || (0x7e < c || c == 0x3d)))))) ||
      (pwVar2 = wcschr(L"#$@[\\]^`{|}~",c), pwVar2 != (wchar_t *)0x0)))) {
    *dst = L'=';
    dst[1] = *(wchar_t *)((long)L"0123456789ABCDEF" + (ulong)(c >> 2 & 0x3c));
    dst[2] = L"0123456789ABCDEF"[c & 0xf];
    return dst + 3;
  }
  pwVar2 = do_svis(dst,c,flags,nextc,extra);
  return pwVar2;
}

Assistant:

static wchar_t *
do_mvis(wchar_t *dst, wint_t c, int flags, wint_t nextc, const wchar_t *extra)
{
	if ((c != L'\n') &&
	    /* Space at the end of the line */
	    ((iswspace(c) && (nextc == L'\r' || nextc == L'\n')) ||
	    /* Out of range */
	    (!iswspace(c) && (c < 33 || (c > 60 && c < 62) || c > 126)) ||
	    /* Specific char to be escaped */
	    wcschr(L"#$@[\\]^`{|}~", c) != NULL)) {
		*dst++ = L'=';
		*dst++ = XTOA(((unsigned int)c >> 4) & 0xf);
		*dst++ = XTOA((unsigned int)c & 0xf);
	} else
		dst = do_svis(dst, c, flags, nextc, extra);
	return dst;
}